

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>_>::
~BasicTypeInfo(BasicTypeInfo<std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>_>
               *this)

{
  (this->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__BasicTypeInfo_00946d88;
  std::__cxx11::string::~string((string *)&this->name_);
  TypeInfo::~TypeInfo(&this->super_TypeInfo);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}